

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

void __thiscall
soul::heart::AggregateInitialiserList::~AggregateInitialiserList(AggregateInitialiserList *this)

{
  AggregateInitialiserList *this_local;
  
  (this->super_Expression).super_Object._vptr_Object =
       (_func_int **)&PTR__AggregateInitialiserList_00640fc0;
  ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::~ArrayWithPreallocation
            (&this->items);
  Type::~Type(&this->type);
  Expression::~Expression(&this->super_Expression);
  return;
}

Assistant:

AggregateInitialiserList (CodeLocation l, const Type& t) : Expression (std::move (l)), type (t) {}